

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall gimage::Histogram::convertToImage(Histogram *this,ImageFloat *image)

{
  unsigned_long uVar1;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  Histogram *in_RDI;
  long unaff_retaddr;
  long in_stack_00000008;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_00000010;
  int i;
  int k;
  float total;
  float local_34;
  float local_20;
  int local_1c;
  int local_18;
  Histogram *d;
  
  d = in_RDI;
  uVar1 = sumAll(in_RDI);
  local_20 = (float)uVar1;
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,(long)d);
  if (0.0 < local_20) {
    for (local_18 = 0; local_18 < *(int *)(in_RDI + 4); local_18 = local_18 + 1) {
      for (local_1c = 0; local_1c < *(int *)in_RDI; local_1c = local_1c + 1) {
        local_34 = (float)*(ulong *)(*(long *)(*(long *)(in_RDI + 0x18) + (long)local_18 * 8) +
                                    (long)local_1c * 8);
        Image<float,_gimage::PixelTraits<float>_>::set
                  (in_RSI,(long)local_1c,(long)local_18,0,local_34 / local_20);
      }
    }
  }
  return;
}

Assistant:

void Histogram::convertToImage(ImageFloat &image) const
{
  float total=static_cast<float>(sumAll());

  image.setSize(w, h, 1);

  if (total > 0)
  {
    for (int k=0; k<h; k++)
    {
      for (int i=0; i<w; i++)
      {
        image.set(i, k, 0, row[k][i]/total);
      }
    }
  }
}